

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user.c
# Opt level: O0

int linux_evfilt_user_knote_delete(filter *filt,knote *kn)

{
  int iVar1;
  long in_RSI;
  int rv;
  filter *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if ((*(ushort *)(in_RSI + 10) & 8) == 0) {
    linux_evfilt_user_knote_disable(in_stack_ffffffffffffffd8,(knote *)0x10b4e6);
  }
  iVar1 = close(*(int *)(in_RSI + 0x80));
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    *(undefined4 *)(in_RSI + 0x80) = 0xffffffff;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
linux_evfilt_user_knote_delete(struct filter *filt, struct knote *kn)
{
    int rv = 0;

    if (KNOTE_ENABLED(kn))
        linux_evfilt_user_knote_disable(filt, kn);

    dbg_printf("event_fd=%i - closed", kn->kn_eventfd);
    if (close(kn->kn_eventfd) < 0) {
        dbg_perror("close(2)");
        return (-1);
    }
    kn->kn_eventfd = -1;

    return rv;
}